

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrcase.cpp
# Opt level: O1

int32_t icu_63::GreekUpper::toUpper
                  (uint32_t options,UChar *dest,int32_t destCapacity,UChar *src,int32_t srcLength,
                  Edits *edits,UErrorCode *errorCode)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  bool bVar4;
  bool bVar5;
  UBool UVar6;
  uint uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  int32_t result;
  int iVar10;
  byte bVar11;
  ulong uVar12;
  int iVar13;
  int unchangedLength;
  int iVar14;
  int i;
  byte bVar15;
  uint uVar16;
  bool bVar17;
  bool bVar18;
  uint local_88;
  UChar *s;
  
  iVar13 = 0;
  uVar12 = 0;
  bVar3 = 0;
  bVar5 = false;
  do {
    iVar10 = (int)uVar12;
    if (srcLength <= iVar13) {
      return iVar10;
    }
    iVar14 = iVar13 + 1;
    uVar16 = (uint)(ushort)src[iVar13];
    i = iVar14;
    if ((((uVar16 & 0xfc00) == 0xd800) && (iVar14 != srcLength)) &&
       (((ushort)src[iVar14] & 0xfc00) == 0xdc00)) {
      i = iVar13 + 2;
      uVar16 = (uint)(ushort)src[iVar13] * 0x400 + (uint)(ushort)src[iVar14] + 0xfca02400;
    }
    uVar7 = ucase_getTypeOrIgnorable_63(uVar16);
    bVar15 = uVar7 != 0;
    bVar4 = uVar7 != 0;
    if ((uVar7 & 4) != 0) {
      bVar15 = bVar3 & 1;
      bVar4 = bVar5;
    }
    uVar8 = getLetterData(uVar16);
    if (uVar8 == 0) {
      result = ucase_toFullUpper_63(uVar16,(UCaseContextIterator *)0x0,(void *)0x0,&s,4);
      uVar16 = anon_unknown_10::appendResult
                         (dest,iVar10,destCapacity,result,s,i - iVar13,options,edits);
      uVar12 = (ulong)uVar16;
      if ((int)uVar16 < 0) {
        *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
        goto LAB_002d6b6b;
      }
      bVar1 = true;
      iVar13 = i;
    }
    else {
      local_88 = uVar8 & 0x3ff;
      if ((((uVar8 >> 0xc & 1) != 0) && ((bVar3 & 2) != 0)) &&
         ((local_88 == 0x3a5 || (local_88 == 0x399)))) {
        uVar8 = uVar8 | 0x8000;
      }
      uVar16 = uVar8 >> 0xd & 1;
      while ((i < srcLength && (uVar9 = getDiacriticData((uint)(ushort)src[i]), uVar9 != 0))) {
        uVar8 = uVar8 | uVar9;
        uVar16 = uVar16 + ((uVar9 >> 0xd & 1) != 0);
        i = i + 1;
      }
      bVar11 = bVar15 + 2;
      if ((uVar8 & 0xd000) != 0x5000) {
        bVar11 = bVar15;
      }
      if ((((local_88 != 0x397) || ((uVar8 >> 0xe & 1) == 0)) || (uVar16 != 0)) ||
         ((bVar5 || (UVar6 = isFollowedByCasedLetter(src,i,srcLength), UVar6 != '\0')))) {
        bVar18 = true;
        bVar1 = false;
        if ((short)uVar8 < 0) {
          if (local_88 == 0x3a5) {
            local_88 = 0x3ab;
            uVar8 = 0;
          }
          else if (local_88 == 0x399) {
            local_88 = 0x3aa;
            uVar8 = 0;
            bVar1 = false;
          }
        }
      }
      else {
        bVar18 = i == iVar13;
        bVar1 = !bVar18;
        local_88 = 0x397;
        if (bVar18) {
          local_88 = 0x389;
        }
      }
      if ((options >> 0xe & 1) == 0 && edits == (Edits *)0x0) {
LAB_002d6a7d:
        if (iVar10 < destCapacity) {
          dest[iVar10] = (UChar)local_88;
LAB_002d6aa8:
          uVar7 = iVar10 + 1;
        }
        else {
          uVar7 = 0xffffffff;
          if (iVar10 != 0x7fffffff) goto LAB_002d6aa8;
        }
        if (((int)uVar7 < 0) || ((uVar8 & 0x18000) == 0)) {
LAB_002d6ad5:
          uVar12 = (ulong)uVar7;
        }
        else {
          if ((int)uVar7 < destCapacity) {
            dest[uVar7] = L'̈';
LAB_002d6ad3:
            uVar7 = uVar7 + 1;
            goto LAB_002d6ad5;
          }
          uVar12 = 0xffffffff;
          if (uVar7 != 0x7fffffff) goto LAB_002d6ad3;
        }
        iVar10 = (int)uVar12;
        if (!(bool)(bVar1 ^ 1U | iVar10 < 0)) {
          if (iVar10 < destCapacity) {
            dest[uVar12] = L'́';
          }
          else {
            uVar12 = 0xffffffff;
            if (iVar10 == 0x7fffffff) goto LAB_002d6b04;
          }
          uVar12 = (ulong)(iVar10 + 1);
        }
LAB_002d6b04:
        if ((-1 < (int)uVar12) && (0 < (int)uVar16)) {
          do {
            iVar10 = (int)uVar12;
            if (iVar10 < destCapacity) {
              dest[uVar12] = L'Ι';
LAB_002d6b27:
              uVar12 = (ulong)(iVar10 + 1);
            }
            else {
              uVar12 = 0xffffffff;
              if (iVar10 != 0x7fffffff) goto LAB_002d6b27;
            }
          } while ((-1 < (int)uVar12) && (bVar1 = 1 < (int)uVar16, uVar16 = uVar16 - 1, bVar1));
        }
        bVar18 = true;
        if ((int)uVar12 < 0) {
          *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
          bVar18 = false;
        }
      }
      else {
        bVar2 = 0 < (int)uVar16 || local_88 != (ushort)src[iVar13];
        if ((uVar8 & 0x18000) != 0) {
          bVar17 = true;
          if (iVar14 < i) {
            bVar17 = src[iVar14] != L'̈';
          }
          bVar2 = (bool)(bVar2 | bVar17);
          iVar14 = iVar13 + 2;
        }
        if (!bVar18) {
          bVar18 = true;
          if (iVar14 < i) {
            bVar18 = src[iVar14] != L'́';
          }
          bVar2 = (bool)(bVar2 | bVar18);
          iVar14 = iVar14 + 1;
        }
        unchangedLength = i - iVar13;
        iVar14 = (iVar14 - iVar13) + uVar16;
        if ((bool)(unchangedLength != iVar14 | bVar2)) {
          if (edits != (Edits *)0x0) {
            Edits::addReplace(edits,unchangedLength,iVar14);
          }
          goto LAB_002d6a7d;
        }
        if (edits != (Edits *)0x0) {
          Edits::addUnchanged(edits,unchangedLength);
        }
        bVar18 = true;
        if ((options >> 0xe & 1) == 0) goto LAB_002d6a7d;
      }
      if (bVar18) {
        bVar1 = true;
        iVar13 = i;
        bVar15 = bVar11;
      }
      else {
LAB_002d6b6b:
        bVar1 = false;
        bVar15 = bVar3;
        bVar4 = bVar5;
      }
    }
    bVar3 = bVar15;
    bVar5 = bVar4;
    if (!bVar1) {
      return 0;
    }
  } while( true );
}

Assistant:

int32_t toUpper(uint32_t options,
                UChar *dest, int32_t destCapacity,
                const UChar *src, int32_t srcLength,
                Edits *edits,
                UErrorCode &errorCode) {
    int32_t destIndex=0;
    uint32_t state = 0;
    for (int32_t i = 0; i < srcLength;) {
        int32_t nextIndex = i;
        UChar32 c;
        U16_NEXT(src, nextIndex, srcLength, c);
        uint32_t nextState = 0;
        int32_t type = ucase_getTypeOrIgnorable(c);
        if ((type & UCASE_IGNORABLE) != 0) {
            // c is case-ignorable
            nextState |= (state & AFTER_CASED);
        } else if (type != UCASE_NONE) {
            // c is cased
            nextState |= AFTER_CASED;
        }
        uint32_t data = getLetterData(c);
        if (data > 0) {
            uint32_t upper = data & UPPER_MASK;
            // Add a dialytika to this iota or ypsilon vowel
            // if we removed a tonos from the previous vowel,
            // and that previous vowel did not also have (or gain) a dialytika.
            // Adding one only to the final vowel in a longer sequence
            // (which does not occur in normal writing) would require lookahead.
            // Set the same flag as for preserving an existing dialytika.
            if ((data & HAS_VOWEL) != 0 && (state & AFTER_VOWEL_WITH_ACCENT) != 0 &&
                    (upper == 0x399 || upper == 0x3A5)) {
                data |= HAS_DIALYTIKA;
            }
            int32_t numYpogegrammeni = 0;  // Map each one to a trailing, spacing, capital iota.
            if ((data & HAS_YPOGEGRAMMENI) != 0) {
                numYpogegrammeni = 1;
            }
            // Skip combining diacritics after this Greek letter.
            while (nextIndex < srcLength) {
                uint32_t diacriticData = getDiacriticData(src[nextIndex]);
                if (diacriticData != 0) {
                    data |= diacriticData;
                    if ((diacriticData & HAS_YPOGEGRAMMENI) != 0) {
                        ++numYpogegrammeni;
                    }
                    ++nextIndex;
                } else {
                    break;  // not a Greek diacritic
                }
            }
            if ((data & HAS_VOWEL_AND_ACCENT_AND_DIALYTIKA) == HAS_VOWEL_AND_ACCENT) {
                nextState |= AFTER_VOWEL_WITH_ACCENT;
            }
            // Map according to Greek rules.
            UBool addTonos = FALSE;
            if (upper == 0x397 &&
                    (data & HAS_ACCENT) != 0 &&
                    numYpogegrammeni == 0 &&
                    (state & AFTER_CASED) == 0 &&
                    !isFollowedByCasedLetter(src, nextIndex, srcLength)) {
                // Keep disjunctive "or" with (only) a tonos.
                // We use the same "word boundary" conditions as for the Final_Sigma test.
                if (i == nextIndex) {
                    upper = 0x389;  // Preserve the precomposed form.
                } else {
                    addTonos = TRUE;
                }
            } else if ((data & HAS_DIALYTIKA) != 0) {
                // Preserve a vowel with dialytika in precomposed form if it exists.
                if (upper == 0x399) {
                    upper = 0x3AA;
                    data &= ~HAS_EITHER_DIALYTIKA;
                } else if (upper == 0x3A5) {
                    upper = 0x3AB;
                    data &= ~HAS_EITHER_DIALYTIKA;
                }
            }

            UBool change;
            if (edits == nullptr && (options & U_OMIT_UNCHANGED_TEXT) == 0) {
                change = TRUE;  // common, simple usage
            } else {
                // Find out first whether we are changing the text.
                change = src[i] != upper || numYpogegrammeni > 0;
                int32_t i2 = i + 1;
                if ((data & HAS_EITHER_DIALYTIKA) != 0) {
                    change |= i2 >= nextIndex || src[i2] != 0x308;
                    ++i2;
                }
                if (addTonos) {
                    change |= i2 >= nextIndex || src[i2] != 0x301;
                    ++i2;
                }
                int32_t oldLength = nextIndex - i;
                int32_t newLength = (i2 - i) + numYpogegrammeni;
                change |= oldLength != newLength;
                if (change) {
                    if (edits != NULL) {
                        edits->addReplace(oldLength, newLength);
                    }
                } else {
                    if (edits != NULL) {
                        edits->addUnchanged(oldLength);
                    }
                    // Write unchanged text?
                    change = (options & U_OMIT_UNCHANGED_TEXT) == 0;
                }
            }

            if (change) {
                destIndex=appendUChar(dest, destIndex, destCapacity, (UChar)upper);
                if (destIndex >= 0 && (data & HAS_EITHER_DIALYTIKA) != 0) {
                    destIndex=appendUChar(dest, destIndex, destCapacity, 0x308);  // restore or add a dialytika
                }
                if (destIndex >= 0 && addTonos) {
                    destIndex=appendUChar(dest, destIndex, destCapacity, 0x301);
                }
                while (destIndex >= 0 && numYpogegrammeni > 0) {
                    destIndex=appendUChar(dest, destIndex, destCapacity, 0x399);
                    --numYpogegrammeni;
                }
                if(destIndex<0) {
                    errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
                    return 0;
                }
            }
        } else {
            const UChar *s;
            c=ucase_toFullUpper(c, NULL, NULL, &s, UCASE_LOC_GREEK);
            destIndex = appendResult(dest, destIndex, destCapacity, c, s,
                                     nextIndex - i, options, edits);
            if (destIndex < 0) {
                errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
                return 0;
            }
        }
        i = nextIndex;
        state = nextState;
    }

    return destIndex;
}